

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

bool nullcInitFileModule(void)

{
  nullres nVar1;
  
  nVar1 = nullcBindModuleFunctionHelper<NULLCFile::File>
                    ("std.file",NULLCFile::FileCreateEmpty,"File",0);
  if (nVar1 == '\0') {
    return false;
  }
  nVar1 = nullcBindModuleFunctionHelper<NULLCFile::File,NULLCArray,NULLCArray>
                    ("std.file",NULLCFile::FileCreate,"File",1);
  if (nVar1 != '\0') {
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,NULLCArray,NULLCFile::File*>
                      ("std.file",NULLCFile::FileOpen,"File::Open",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCFile::File*>
                      ("std.file",NULLCFile::FileClose,"File::Close",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCFile::File*>
                      ("std.file",NULLCFile::FileOpened,"File::Opened",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCFile::File*>
                      ("std.file",NULLCFile::FileEof,"File::Eof",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,int,int,NULLCFile::File*>
                      ("std.file",NULLCFile::FileSeek,"File::Seek",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<int,char,NULLCFile::File*>
                      ("std.file",NULLCFile::FileWriteC,"File::Write",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<int,short,NULLCFile::File*>
                      ("std.file",NULLCFile::FileWriteS,"File::Write",1);
    if ((((nVar1 != '\0') &&
         (nVar1 = nullcBindModuleFunctionHelper<int,int,NULLCFile::File*>
                            ("std.file",NULLCFile::FileWriteI,"File::Write",2), nVar1 != '\0')) &&
        (nVar1 = nullcBindModuleFunctionHelper<int,long_long,NULLCFile::File*>
                           ("std.file",NULLCFile::FileWriteL,"File::Write",3), nVar1 != '\0')) &&
       ((nVar1 = nullcBindModuleFunctionHelper<int,float,NULLCFile::File*>
                           ("std.file",NULLCFile::FileWriteF,"File::Write",4), nVar1 != '\0' &&
        (nVar1 = nullcBindModuleFunctionHelper<int,double,NULLCFile::File*>
                           ("std.file",NULLCFile::FileWriteD,"File::Write",5), nVar1 != '\0')))) {
      nVar1 = nullcBindModuleFunctionHelper<int,char*,NULLCFile::File*>
                        ("std.file",NULLCFile::FileReadC,"File::Read",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<int,short*,NULLCFile::File*>
                        ("std.file",NULLCFile::FileReadS,"File::Read",1);
      if ((((nVar1 != '\0') &&
           (nVar1 = nullcBindModuleFunctionHelper<int,int*,NULLCFile::File*>
                              ("std.file",NULLCFile::FileReadI,"File::Read",2), nVar1 != '\0')) &&
          ((nVar1 = nullcBindModuleFunctionHelper<int,long_long*,NULLCFile::File*>
                              ("std.file",NULLCFile::FileReadL,"File::Read",3), nVar1 != '\0' &&
           (((nVar1 = nullcBindModuleFunctionHelper<int,float*,NULLCFile::File*>
                                ("std.file",NULLCFile::FileReadF,"File::Read",4), nVar1 != '\0' &&
             (nVar1 = nullcBindModuleFunctionHelper<int,double*,NULLCFile::File*>
                                ("std.file",NULLCFile::FileReadD,"File::Read",5), nVar1 != '\0')) &&
            (nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCFile::File*>
                               ("std.file",NULLCFile::FileRead,"File::Read",6), nVar1 != '\0'))))))
         && (nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCFile::File*>
                               ("std.file",NULLCFile::FileWrite,"File::Write",6), nVar1 != '\0')) {
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCFile::File*>
                          ("std.file",NULLCFile::FilePrint,"File::Print",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<long_long,NULLCFile::File*>
                          ("std.file",NULLCFile::FileTell,"File::Tell",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<long_long,NULLCFile::File*>
                          ("std.file",NULLCFile::FileSize,"File::Size",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,unsigned_int,unsigned_int,NULLCFile::File*>
                          ("std.file",NULLCFile::FileReadArr,"File::Read",7);
        if (nVar1 != '\0') {
          nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,unsigned_int,unsigned_int,NULLCFile::File*>
                            ("std.file",NULLCFile::FileWriteArr,"File::Write",7);
          return nVar1 != '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

bool nullcInitFileModule()
{
	REGISTER_FUNC(FileCreateEmpty, "File", 0);
	REGISTER_FUNC(FileCreate, "File", 1);

	REGISTER_FUNC(FileOpen, "File::Open", 0);
	REGISTER_FUNC(FileClose, "File::Close", 0);

	REGISTER_FUNC(FileOpened, "File::Opened", 0);
	REGISTER_FUNC(FileEof, "File::Eof", 0);

	REGISTER_FUNC(FileSeek, "File::Seek", 0);

	REGISTER_FUNC(FileWriteC, "File::Write", 0);
	REGISTER_FUNC(FileWriteS, "File::Write", 1);
	REGISTER_FUNC(FileWriteI, "File::Write", 2);
	REGISTER_FUNC(FileWriteL, "File::Write", 3);
	REGISTER_FUNC(FileWriteF, "File::Write", 4);
	REGISTER_FUNC(FileWriteD, "File::Write", 5);

	REGISTER_FUNC(FileReadC, "File::Read", 0);
	REGISTER_FUNC(FileReadS, "File::Read", 1);
	REGISTER_FUNC(FileReadI, "File::Read", 2);
	REGISTER_FUNC(FileReadL, "File::Read", 3);
	REGISTER_FUNC(FileReadF, "File::Read", 4);
	REGISTER_FUNC(FileReadD, "File::Read", 5);

	REGISTER_FUNC(FileRead, "File::Read", 6);
	REGISTER_FUNC(FileWrite, "File::Write", 6);
	REGISTER_FUNC(FilePrint, "File::Print", 0);

	REGISTER_FUNC(FileTell, "File::Tell", 0);
	REGISTER_FUNC(FileSize, "File::Size", 0);
	REGISTER_FUNC(FileReadArr, "File::Read", 7);
	REGISTER_FUNC(FileWriteArr, "File::Write", 7);
	return true;
}